

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

Schema __thiscall capnp::SchemaLoader::get(SchemaLoader *this,uint64_t id,Reader brand,Schema scope)

{
  RawBrandedSchema *pRVar1;
  NullableValue<capnp::Schema> *other;
  Schema *pSVar2;
  CappedArray<char,_17UL> local_c0;
  Fault local_a0;
  Fault f;
  Schema *result;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  NullableValue<capnp::Schema> _result2142;
  uint64_t id_local;
  SchemaLoader *this_local;
  Schema scope_local;
  
  _result2142.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)id;
  tryGet((SchemaLoader *)local_48,(uint64_t)this,brand,(Schema)id);
  other = kj::_::readMaybe<capnp::Schema>((Maybe<capnp::Schema> *)local_48);
  kj::_::NullableValue<capnp::Schema>::NullableValue((NullableValue<capnp::Schema> *)local_38,other)
  ;
  kj::Maybe<capnp::Schema>::~Maybe((Maybe<capnp::Schema> *)local_48);
  pSVar2 = kj::_::NullableValue::operator_cast_to_Schema_((NullableValue *)local_38);
  if (pSVar2 != (Schema *)0x0) {
    f.exception = (Exception *)
                  kj::_::NullableValue<capnp::Schema>::operator*
                            ((NullableValue<capnp::Schema> *)local_38);
    pRVar1 = (RawBrandedSchema *)((f.exception)->ownFile).content.ptr;
    kj::_::NullableValue<capnp::Schema>::~NullableValue((NullableValue<capnp::Schema> *)local_38);
    return (Schema)pRVar1;
  }
  kj::hex(&local_c0,(unsigned_long)_result2142.field_1);
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[29],kj::CappedArray<char,17ul>>
            (&local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
             ,0x861,FAILED,(char *)0x0,"\"no schema node loaded for id\", kj::hex(id)",
             (char (*) [29])"no schema node loaded for id",&local_c0);
  kj::_::Debug::Fault::fatal(&local_a0);
}

Assistant:

Schema SchemaLoader::get(uint64_t id, schema::Brand::Reader brand, Schema scope) const {
  KJ_IF_SOME(result, tryGet(id, brand, scope)) {
    return result;
  } else {
    KJ_FAIL_REQUIRE("no schema node loaded for id", kj::hex(id));
  }
}